

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O0

void __thiscall HRSS_NoWritesToConstData_Test::TestBody(HRSS_NoWritesToConstData_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_2a38;
  Message local_2a30;
  int local_2a28;
  int local_2a24;
  undefined1 local_2a20 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_29f0;
  Message local_29e8;
  int local_29dc;
  undefined1 local_29d8 [8];
  AssertionResult gtest_ar__2;
  Message local_29c0;
  int local_29b8;
  int local_29b4;
  undefined1 local_29b0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2980;
  Message local_2978;
  int local_296c;
  undefined1 local_2968 [8];
  AssertionResult gtest_ar__1;
  uint8_t encap_entropy [1400];
  uint8_t local_23d8 [8];
  uint8_t shared_key [32];
  uint8_t ciphertext [1138];
  AssertHelper local_1f20;
  Message local_1f18 [3];
  int local_1efc;
  undefined1 local_1ef8 [8];
  AssertionResult gtest_ar_;
  HRSS_private_key priv_orig;
  HRSS_private_key priv;
  HRSS_public_key pub_orig;
  HRSS_public_key pub;
  uint8_t generate_key_entropy [1432];
  HRSS_NoWritesToConstData_Test *this_local;
  
  RAND_bytes(pub.opaque + 0x588,0x598);
  ::OPENSSL_memset(pub_orig.opaque + 0x588,0xa3,0x590);
  ::OPENSSL_memset(priv_orig.opaque + 0x708,0x3a,0x710);
  local_1efc = HRSS_generate_key((HRSS_public_key *)(pub_orig.opaque + 0x588),
                                 (HRSS_private_key *)(priv_orig.opaque + 0x708),pub.opaque + 0x588);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_1ef8,&local_1efc,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ef8);
  if (!bVar1) {
    testing::Message::Message(local_1f18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(ciphertext + 0x470),(internal *)local_1ef8,
               (AssertionResult *)"HRSS_generate_key(&pub, &priv, generate_key_entropy)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f20,local_1f18);
    testing::internal::AssertHelper::~AssertHelper(&local_1f20);
    std::__cxx11::string::~string((string *)(ciphertext + 0x470));
    testing::Message::~Message(local_1f18);
  }
  ciphertext[0x46d] = '\0';
  ciphertext[0x46e] = '\0';
  ciphertext[0x46f] = '\0';
  ciphertext[0x46c] = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ef8);
  if (ciphertext._1132_4_ == 0) {
    ::OPENSSL_memcpy(&gtest_ar_.message_,priv_orig.opaque + 0x708,0x710);
    ::OPENSSL_memcpy(priv.opaque + 0x708,pub_orig.opaque + 0x588,0x590);
    RAND_bytes((uchar *)&gtest_ar__1.message_,0x578);
    local_296c = HRSS_encap(shared_key + 0x18,local_23d8,
                            (HRSS_public_key *)(pub_orig.opaque + 0x588),
                            (uint8_t *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_2968,&local_296c,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2968);
    if (!bVar1) {
      testing::Message::Message(&local_2978);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_2968,
                 (AssertionResult *)"HRSS_encap(ciphertext, shared_key, &pub, encap_entropy)",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2980,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0xde,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2980,&local_2978);
      testing::internal::AssertHelper::~AssertHelper(&local_2980);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_2978);
    }
    ciphertext[0x46d] = '\0';
    ciphertext[0x46e] = '\0';
    ciphertext[0x46f] = '\0';
    ciphertext[0x46c] = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2968);
    if (ciphertext._1132_4_ == 0) {
      local_29b4 = ::OPENSSL_memcmp(pub_orig.opaque + 0x588,priv.opaque + 0x708,0x590);
      local_29b8 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_29b0,"OPENSSL_memcmp(&pub, &pub_orig, sizeof(pub))","0",
                 &local_29b4,&local_29b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_29b0);
      if (!bVar1) {
        testing::Message::Message(&local_29c0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_29b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xe0,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__2.message_,&local_29c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_29c0);
      }
      ciphertext[0x46d] = '\0';
      ciphertext[0x46e] = '\0';
      ciphertext[0x46f] = '\0';
      ciphertext[0x46c] = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_29b0);
      if (ciphertext._1132_4_ == 0) {
        local_29dc = HRSS_decap(local_23d8,(HRSS_private_key *)(priv_orig.opaque + 0x708),
                                shared_key + 0x18,0x472);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_29d8,&local_29dc,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_29d8);
        if (!bVar1) {
          testing::Message::Message(&local_29e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_1.message_,(internal *)local_29d8,
                     (AssertionResult *)
                     "HRSS_decap(shared_key, &priv, ciphertext, sizeof(ciphertext))","false","true",
                     in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_29f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                     ,0xe2,pcVar2);
          testing::internal::AssertHelper::operator=(&local_29f0,&local_29e8);
          testing::internal::AssertHelper::~AssertHelper(&local_29f0);
          std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_29e8);
        }
        ciphertext[0x46d] = '\0';
        ciphertext[0x46e] = '\0';
        ciphertext[0x46f] = '\0';
        ciphertext[0x46c] = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_29d8);
        if (ciphertext._1132_4_ == 0) {
          local_2a24 = ::OPENSSL_memcmp(priv_orig.opaque + 0x708,&gtest_ar_.message_,0x710);
          local_2a28 = 0;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_2a20,"OPENSSL_memcmp(&priv, &priv_orig, sizeof(priv))","0",
                     &local_2a24,&local_2a28);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a20);
          if (!bVar1) {
            testing::Message::Message(&local_2a30);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a20);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2a38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                       ,0xe4,pcVar2);
            testing::internal::AssertHelper::operator=(&local_2a38,&local_2a30);
            testing::internal::AssertHelper::~AssertHelper(&local_2a38);
            testing::Message::~Message(&local_2a30);
          }
          ciphertext[0x46d] = '\0';
          ciphertext[0x46e] = '\0';
          ciphertext[0x46f] = '\0';
          ciphertext[0x46c] = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a20);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(HRSS, NoWritesToConstData) {
  // Normalisation of some polynomials used to write into the generated keys.
  // This is fine in a purely ephemeral setting, but triggers TSAN warnings in
  // more complex ones.
  uint8_t generate_key_entropy[HRSS_GENERATE_KEY_BYTES];
  RAND_bytes(generate_key_entropy, sizeof(generate_key_entropy));
  HRSS_public_key pub, pub_orig;
  HRSS_private_key priv, priv_orig;
  OPENSSL_memset(&pub, 0xa3, sizeof(pub));
  OPENSSL_memset(&priv, 0x3a, sizeof(priv));
  ASSERT_TRUE(HRSS_generate_key(&pub, &priv, generate_key_entropy));
  OPENSSL_memcpy(&priv_orig, &priv, sizeof(priv));
  OPENSSL_memcpy(&pub_orig, &pub, sizeof(pub));

  uint8_t ciphertext[HRSS_CIPHERTEXT_BYTES];
  uint8_t shared_key[HRSS_KEY_BYTES];
  uint8_t encap_entropy[HRSS_ENCAP_BYTES];
  RAND_bytes(encap_entropy, sizeof(encap_entropy));
  ASSERT_TRUE(HRSS_encap(ciphertext, shared_key, &pub, encap_entropy));

  ASSERT_EQ(OPENSSL_memcmp(&pub, &pub_orig, sizeof(pub)), 0);

  ASSERT_TRUE(HRSS_decap(shared_key, &priv, ciphertext, sizeof(ciphertext)));

  ASSERT_EQ(OPENSSL_memcmp(&priv, &priv_orig, sizeof(priv)), 0);
}